

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void dfg_ready_handler(CManager_conflict cm,CMConnection conn,void *vmsg,void *client_data,
                      attr_list attrs)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  pthread_t pVar4;
  CManager in_RCX;
  undefined4 *in_RDX;
  long in_RDI;
  EVclient in_R8;
  timespec ts_1;
  timespec ts;
  EVready_ptr msg;
  EVclient client;
  FILE *in_stack_ffffffffffffff98;
  CManager in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  CManager in_stack_ffffffffffffffb0;
  timespec local_48;
  CMTraceType trace_type;
  CManager cm_00;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  *(undefined4 *)&in_RCX->in_formats = *in_RDX;
  cm_00 = in_RCX;
  IntCManager_lock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  trace_type = (CMTraceType)((ulong)in_RDX >> 0x20);
  enable_auto_stones(cm_00,in_R8);
  if (*(int *)&in_RCX->field_0x1c != -1) {
    iVar1 = CMtrace_val[0xd];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init(in_RCX,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffff98 = *(FILE **)(in_RDI + 0x120);
        _Var2 = getpid();
        in_stack_ffffffffffffffa0 = (CManager)(long)_Var2;
        pVar4 = pthread_self();
        fprintf(in_stack_ffffffffffffff98,"P%lxT%lx - ",in_stack_ffffffffffffffa0,pVar4);
      }
      iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"Client DFG %p Node id %d is ready, signalling %d\n",in_RCX
              ,(ulong)*(uint *)&in_RCX->in_formats,(ulong)*(uint *)&in_RCX->field_0x1c);
    }
    fflush(*(FILE **)(in_RDI + 0x120));
    INT_CMCondition_signal(in_stack_ffffffffffffffa0,iVar3);
    iVar3 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    goto LAB_0016247c;
  }
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar3 = CMtrace_init(in_RCX,trace_type);
    if (iVar3 != 0) goto LAB_001623b2;
LAB_00162469:
    iVar3 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  }
  else {
    if (CMtrace_val[0xd] == 0) goto LAB_00162469;
LAB_001623b2:
    iVar3 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    if (CMtrace_PID != 0) {
      __stream = *(FILE **)(in_RDI + 0x120);
      _Var2 = getpid();
      pVar4 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&stack0xffffffffffffffa8);
      fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffa8,
              in_stack_ffffffffffffffb0);
    }
    fprintf(*(FILE **)(in_RDI + 0x120),"Client DFG %p Node id %d got ready, reconfig done\n",in_RCX,
            (ulong)*(uint *)&in_RCX->in_formats);
  }
  fflush(*(FILE **)(in_RDI + 0x120));
LAB_0016247c:
  IntCManager_unlock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,iVar3);
  return;
}

Assistant:

static void
dfg_ready_handler(CManager cm, CMConnection conn, void *vmsg, 
		  void *client_data, attr_list attrs)
{
    EVclient client = client_data;
    EVready_ptr msg =  vmsg;
    (void) conn;
    (void) attrs;
    client->my_node_id = msg->node_id;
    CManager_lock(cm);
    enable_auto_stones(cm, client);
    if (client->ready_condition != -1) {
	CMtrace_out(cm, EVdfgVerbose, "Client DFG %p Node id %d is ready, signalling %d\n", client, client->my_node_id, client->ready_condition);
	INT_CMCondition_signal(cm, client->ready_condition);
    } else {
	CMtrace_out(cm, EVdfgVerbose, "Client DFG %p Node id %d got ready, reconfig done\n", client, client->my_node_id);
    }	
    CManager_unlock(cm);
}